

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O2

int tool_debug_cb(CURL *handle,curl_infotype type,uchar *data,size_t size,void *userdata)

{
  trace tVar1;
  GlobalConfig *config;
  uchar uVar2;
  int iVar3;
  time_t tVar4;
  tm *ptVar5;
  FILE *pFVar6;
  FILE *__stream;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uchar *puVar11;
  ulong uVar12;
  bool bVar13;
  timeval tVar14;
  char timebuf [20];
  time_t secs;
  
  config = *(GlobalConfig **)((long)userdata + 0x3b8);
  __stream = (FILE *)config->errors;
  if (config->tracetime == true) {
    tVar14 = tool_tvnow();
    if (tool_debug_cb_known_offset != '\x01') {
      tVar4 = time((time_t *)0x0);
      tool_debug_cb::epoch_offset = tVar4 - tVar14.tv_sec;
      tool_debug_cb_known_offset = '\x01';
    }
    secs = tool_debug_cb::epoch_offset + tVar14.tv_sec;
    ptVar5 = localtime(&secs);
    curl_msnprintf(timebuf,0x14,"%02d:%02d:%02d.%06ld ",ptVar5->tm_hour,ptVar5->tm_min,
                   ptVar5->tm_sec,tVar14.tv_usec);
  }
  else {
    timebuf[0] = '\0';
  }
  pFVar6 = (FILE *)config->trace_stream;
  if (pFVar6 == (FILE *)0x0) {
    iVar3 = curl_strequal("-",config->trace_dump);
    pFVar6 = _stdout;
    if (iVar3 == 0) {
      iVar3 = curl_strequal("%",config->trace_dump);
      if (iVar3 == 0) {
        pFVar6 = fopen64(config->trace_dump,"w");
        config->trace_stream = (FILE *)pFVar6;
        config->trace_fopened = true;
        goto LAB_00108838;
      }
      pFVar6 = (FILE *)config->errors;
    }
    config->trace_stream = (FILE *)pFVar6;
  }
LAB_00108838:
  if (pFVar6 != (FILE *)0x0) {
    __stream = pFVar6;
  }
  if (__stream == (FILE *)0x0) {
    warnf(config,"Failed to create/open output");
    return 0;
  }
  tVar1 = config->tracetype;
  uVar12 = (ulong)type;
  if (tVar1 == TRACE_PLAIN) {
    if (type - CURLINFO_DATA_IN < 4) {
      if (tool_debug_cb_traced_data != '\0') {
        return 0;
      }
      if (config->isatty == true) {
        if (__stream == _stderr) {
          return 0;
        }
        if (__stream == _stdout) {
          return 0;
        }
      }
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",timebuf,tool_debug_cb::s_infotype[uVar12]);
      }
      curl_mfprintf(__stream,"[%zd bytes data]\n",size);
      tool_debug_cb::newl = false;
      tool_debug_cb_traced_data = 1;
      return 0;
    }
    if (type < CURLINFO_HEADER_OUT) {
      if (tool_debug_cb::newl == false) {
        curl_mfprintf(__stream,"%s%s ",timebuf,tool_debug_cb::s_infotype[uVar12]);
      }
      fwrite(data,size,1,__stream);
      if (size != 0) {
LAB_00108c55:
        tool_debug_cb::newl = data[size - 1] != '\n';
        tool_debug_cb_traced_data = 0;
        return 0;
      }
    }
    else {
      if (type != CURLINFO_HEADER_OUT) {
        tool_debug_cb::newl = false;
        tool_debug_cb_traced_data = 0;
        return 0;
      }
      if (size != 0) {
        lVar9 = 0;
        do {
          lVar8 = -1;
          puVar11 = data;
          while( true ) {
            if (lVar9 - size == lVar8) {
              if (tool_debug_cb::newl == false) {
                curl_mfprintf(__stream,"%s%s ",timebuf,">");
              }
              fwrite(data + lVar9,size - lVar9,1,__stream);
              goto LAB_00108c55;
            }
            if (puVar11[lVar9] == '\n') break;
            lVar8 = lVar8 + -1;
            puVar11 = puVar11 + 1;
          }
          if (tool_debug_cb::newl == false) {
            curl_mfprintf(__stream,"%s%s ",timebuf,">");
          }
          puVar11 = data + lVar9;
          lVar9 = lVar9 - lVar8;
          fwrite(puVar11,-lVar8,1,__stream);
          tool_debug_cb::newl = false;
        } while( true );
      }
    }
    tool_debug_cb::newl = false;
    tool_debug_cb_traced_data = 0;
    return 0;
  }
  switch(uVar12) {
  case 0:
    curl_mfprintf(__stream,"%s== Info: %s",timebuf,data);
    return 0;
  case 1:
    pcVar7 = "<= Recv header";
    break;
  case 2:
    pcVar7 = "=> Send header";
    break;
  case 3:
    pcVar7 = "<= Recv data";
    break;
  case 4:
    pcVar7 = "=> Send data";
    break;
  case 5:
    pcVar7 = "<= Recv SSL data";
    break;
  case 6:
    pcVar7 = "=> Send SSL data";
    break;
  default:
    goto switchD_00108923_default;
  }
  lVar9 = 0x10;
  if (tVar1 == TRACE_ASCII) {
    lVar9 = 0x40;
  }
  curl_mfprintf(__stream,"%s%s, %zd bytes (0x%zx)\n",timebuf,pcVar7,size,size);
  for (uVar12 = 0; uVar12 < size; uVar12 = uVar12 + lVar9) {
    curl_mfprintf(__stream,"%04zx: ",uVar12);
    lVar8 = lVar9;
    uVar10 = uVar12;
    if (tVar1 == TRACE_BIN) {
      while (bVar13 = lVar8 != 0, lVar8 = lVar8 + -1, bVar13) {
        if (uVar10 < size) {
          curl_mfprintf(__stream,"%02x ",data[uVar10]);
        }
        else {
          fputs("   ",__stream);
        }
        uVar10 = uVar10 + 1;
      }
    }
    lVar8 = 0;
    puVar11 = data + 2;
LAB_00108b3e:
    if ((lVar9 == lVar8) || (size <= uVar12 + lVar8)) goto LAB_00108bf8;
    if (tVar1 != TRACE_ASCII) {
      uVar2 = puVar11[uVar12 - 2];
      if ((char)uVar2 < ' ') {
        uVar2 = '.';
      }
      curl_mfprintf(__stream,"%c",uVar2);
      goto LAB_00108bdd;
    }
    uVar2 = puVar11[uVar12 - 2];
    if ((size <= uVar12 + lVar8 + 1) || (uVar2 != '\r')) {
      if ((char)uVar2 < ' ') {
        uVar2 = '.';
      }
LAB_00108baf:
      curl_mfprintf(__stream,"%c",uVar2);
      if (((uVar12 + lVar8 + 2 < size) && (puVar11[uVar12 - 1] == '\r')) &&
         (puVar11[uVar12] == '\n')) {
        uVar12 = (uVar12 + lVar8) - 0x3d;
        goto LAB_00108bf8;
      }
LAB_00108bdd:
      lVar8 = lVar8 + 1;
      puVar11 = puVar11 + 1;
      goto LAB_00108b3e;
    }
    uVar2 = '.';
    if (puVar11[uVar12 - 1] != '\n') goto LAB_00108baf;
    uVar12 = (uVar12 + lVar8) - 0x3e;
LAB_00108bf8:
    fputc(10,__stream);
  }
  fflush(__stream);
switchD_00108923_default:
  return 0;
}

Assistant:

int tool_debug_cb(CURL *handle, curl_infotype type,
                  unsigned char *data, size_t size,
                  void *userdata)
{
  struct OperationConfig *operation = userdata;
  struct GlobalConfig *config = operation->global;
  FILE *output = config->errors;
  const char *text;
  struct timeval tv;
  struct tm *now;
  char timebuf[20];
  time_t secs;
  static time_t epoch_offset;
  static int    known_offset;

  (void)handle; /* not used */

  if(config->tracetime) {
    tv = tvnow();
    if(!known_offset) {
      epoch_offset = time(NULL) - tv.tv_sec;
      known_offset = 1;
    }
    secs = epoch_offset + tv.tv_sec;
    now = localtime(&secs);  /* not thread safe but we don't care */
    snprintf(timebuf, sizeof(timebuf), "%02d:%02d:%02d.%06ld ",
             now->tm_hour, now->tm_min, now->tm_sec, (long)tv.tv_usec);
  }
  else
    timebuf[0] = 0;

  if(!config->trace_stream) {
    /* open for append */
    if(curlx_strequal("-", config->trace_dump))
      config->trace_stream = stdout;
    else if(curlx_strequal("%", config->trace_dump))
      /* Ok, this is somewhat hackish but we do it undocumented for now */
      config->trace_stream = config->errors;  /* aka stderr */
    else {
      config->trace_stream = fopen(config->trace_dump, FOPEN_WRITETEXT);
      config->trace_fopened = TRUE;
    }
  }

  if(config->trace_stream)
    output = config->trace_stream;

  if(!output) {
    warnf(config, "Failed to create/open output");
    return 0;
  }

  if(config->tracetype == TRACE_PLAIN) {
    /*
     * This is the trace look that is similar to what libcurl makes on its
     * own.
     */
    static const char * const s_infotype[] = {
      "*", "<", ">", "{", "}", "{", "}"
    };
    size_t i;
    size_t st = 0;
    static bool newl = FALSE;
    static bool traced_data = FALSE;

    switch(type) {
    case CURLINFO_HEADER_OUT:
      if(size > 0) {
        for(i = 0; i < size - 1; i++) {
          if(data[i] == '\n') { /* LF */
            if(!newl) {
              fprintf(output, "%s%s ", timebuf, s_infotype[type]);
            }
            (void)fwrite(data + st, i - st + 1, 1, output);
            st = i + 1;
            newl = FALSE;
          }
        }
        if(!newl)
          fprintf(output, "%s%s ", timebuf, s_infotype[type]);
        (void)fwrite(data + st, i - st + 1, 1, output);
      }
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_TEXT:
    case CURLINFO_HEADER_IN:
      if(!newl)
        fprintf(output, "%s%s ", timebuf, s_infotype[type]);
      (void)fwrite(data, size, 1, output);
      newl = (size && (data[size - 1] != '\n')) ? TRUE : FALSE;
      traced_data = FALSE;
      break;
    case CURLINFO_DATA_OUT:
    case CURLINFO_DATA_IN:
    case CURLINFO_SSL_DATA_IN:
    case CURLINFO_SSL_DATA_OUT:
      if(!traced_data) {
        /* if the data is output to a tty and we're sending this debug trace
           to stderr or stdout, we don't display the alert about the data not
           being shown as the data _is_ shown then just not via this
           function */
        if(!config->isatty || ((output != stderr) && (output != stdout))) {
          if(!newl)
            fprintf(output, "%s%s ", timebuf, s_infotype[type]);
          fprintf(output, "[%zd bytes data]\n", size);
          newl = FALSE;
          traced_data = TRUE;
        }
      }
      break;
    default: /* nada */
      newl = FALSE;
      traced_data = FALSE;
      break;
    }

    return 0;
  }

#ifdef CURL_DOES_CONVERSIONS
  /* Special processing is needed for CURLINFO_HEADER_OUT blocks
   * if they contain both headers and data (separated by CRLFCRLF).
   * We dump the header text and then switch type to CURLINFO_DATA_OUT.
   */
  if((type == CURLINFO_HEADER_OUT) && (size > 4)) {
    size_t i;
    for(i = 0; i < size - 4; i++) {
      if(memcmp(&data[i], "\r\n\r\n", 4) == 0) {
        /* dump everything through the CRLFCRLF as a sent header */
        text = "=> Send header";
        dump(timebuf, text, output, data, i + 4, config->tracetype, type);
        data += i + 3;
        size -= i + 4;
        type = CURLINFO_DATA_OUT;
        data += 1;
        break;
      }
    }
  }
#endif /* CURL_DOES_CONVERSIONS */

  switch (type) {
  case CURLINFO_TEXT:
    fprintf(output, "%s== Info: %s", timebuf, data);
  default: /* in case a new one is introduced to shock us */
    return 0;

  case CURLINFO_HEADER_OUT:
    text = "=> Send header";
    break;
  case CURLINFO_DATA_OUT:
    text = "=> Send data";
    break;
  case CURLINFO_HEADER_IN:
    text = "<= Recv header";
    break;
  case CURLINFO_DATA_IN:
    text = "<= Recv data";
    break;
  case CURLINFO_SSL_DATA_IN:
    text = "<= Recv SSL data";
    break;
  case CURLINFO_SSL_DATA_OUT:
    text = "=> Send SSL data";
    break;
  }

  dump(timebuf, text, output, data, size, config->tracetype, type);
  return 0;
}